

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

glist_t hash_table_tolist(hash_table_t *h,int32 *count)

{
  hash_entry_t *ptr;
  int local_30;
  int local_2c;
  int32 j;
  int32 i;
  hash_entry_t *e;
  glist_t g;
  int32 *count_local;
  hash_table_t *h_local;
  
  e = (hash_entry_t *)0x0;
  local_30 = 0;
  for (local_2c = 0; local_2c < h->size; local_2c = local_2c + 1) {
    ptr = h->table + local_2c;
    if (ptr->key != (char *)0x0) {
      e = (hash_entry_t *)glist_add_ptr((glist_t)e,ptr);
      for (_j = ptr->next; local_30 = local_30 + 1, _j != (hash_entry_s *)0x0; _j = _j->next) {
        e = (hash_entry_t *)glist_add_ptr((glist_t)e,_j);
      }
    }
  }
  if (count != (int32 *)0x0) {
    *count = local_30;
  }
  return (glist_t)e;
}

Assistant:

glist_t
hash_table_tolist(hash_table_t * h, int32 * count)
{
    glist_t g;
    hash_entry_t *e;
    int32 i, j;

    g = NULL;

    j = 0;
    for (i = 0; i < h->size; i++) {
        e = &(h->table[i]);

        if (e->key != NULL) {
            g = glist_add_ptr(g, (void *) e);
            j++;

            for (e = e->next; e; e = e->next) {
                g = glist_add_ptr(g, (void *) e);
                j++;
            }
        }
    }

    if (count)
        *count = j;

    return g;
}